

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::GeneratedMessageFileName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,Descriptor *message,bool is_descriptor)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int local_44;
  undefined1 local_40 [4];
  int i;
  string result;
  bool is_descriptor_local;
  Descriptor *message_local;
  
  result.field_2._M_local_buf[0xf] = (byte)message & 1;
  FullClassName<google::protobuf::Descriptor>
            ((string *)local_40,(Descriptor *)this,(bool)result.field_2._M_local_buf[0xf]);
  local_44 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_44) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar2 == '\\') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar3 = 0x2f;
    }
    local_44 = local_44 + 1;
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 ".php");
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMessageFileName(const Descriptor* message,
                                     bool is_descriptor) {
  std::string result = FullClassName(message, is_descriptor);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '\\') {
      result[i] = '/';
    }
  }
  return result + ".php";
}